

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall
icu_63::RBBITableBuilder::buildSafeReverseTable(RBBITableBuilder *this,UErrorCode *status)

{
  char16_t *pcVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  UVector *pUVar5;
  UnicodeString *pUVar6;
  UnicodeString *this_00;
  undefined4 uVar7;
  undefined8 uVar8;
  int32_t index;
  code *this_01;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  IntPair states;
  UnicodeString safePairs;
  undefined1 local_88 [24];
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_88._8_8_ = status;
  uVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  if (0 < (int)uVar2) {
    iVar11 = this->fDStates->count;
    local_88._16_8_ = ZEXT48(uVar2);
    uVar12 = 0;
    do {
      uVar10 = 0;
      do {
        iVar14 = -1;
        if (iVar11 < 2) {
          iVar3 = 0;
        }
        else {
          iVar13 = 2;
          do {
            pvVar4 = UVector::elementAt(this->fDStates,iVar13 + -1);
            status = (UErrorCode *)0x0;
            if ((long)uVar12 < (long)*(int *)(*(long *)((long)pvVar4 + 0x28) + 8)) {
              status = (UErrorCode *)
                       (ulong)*(uint *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x18) +
                                       uVar12 * 4);
            }
            pvVar4 = UVector::elementAt(this->fDStates,(int32_t)status);
            iVar3 = 0;
            if ((long)uVar10 < (long)*(int *)(*(long *)((long)pvVar4 + 0x28) + 8)) {
              iVar3 = *(int *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x18) + uVar10 * 4);
            }
            bVar15 = iVar14 == iVar3;
            bVar16 = iVar14 < 0;
            if (bVar16) {
              iVar14 = iVar3;
            }
          } while ((bVar16 || bVar15) && (bVar15 = iVar13 < iVar11, iVar13 = iVar13 + 1, bVar15));
        }
        pUVar6 = (UnicodeString *)local_88;
        if (iVar14 == iVar3) {
          local_88._0_2_ = (short)uVar12;
          UnicodeString::doAppend(&local_70,(UChar *)pUVar6,0,1);
          local_88._0_2_ = (short)uVar10;
          UnicodeString::doAppend(&local_70,(UChar *)pUVar6,0,1);
          status = (UErrorCode *)pUVar6;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_88._16_8_);
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_88._16_8_);
  }
  pUVar5 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status);
  if (pUVar5 == (UVector *)0x0) {
    pUVar5 = (UVector *)0x0;
    this_01 = (code *)status;
  }
  else {
    this_01 = uprv_deleteUObject_63;
    UVector::UVector(pUVar5,uprv_deleteUObject_63,uhash_compareUnicodeString_63,uVar2 + 2,
                     (UErrorCode *)local_88._8_8_);
  }
  this->fSafeTable = pUVar5;
  iVar11 = uVar2 + 2;
  if (-2 < (int)uVar2) {
    iVar14 = 1;
    if (1 < iVar11) {
      iVar14 = iVar11;
    }
    do {
      pUVar5 = this->fSafeTable;
      this_01 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_01);
      if ((UnicodeString *)this_01 == (UnicodeString *)0x0) {
        this_01 = (code *)0x0;
      }
      else {
        UnicodeString::UnicodeString((UnicodeString *)this_01,uVar2,0,uVar2 + 4);
      }
      UVector::addElement(pUVar5,this_01,(UErrorCode *)local_88._8_8_);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  pUVar6 = (UnicodeString *)UVector::elementAt(this->fSafeTable,1);
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      UnicodeString::setCharAt(pUVar6,uVar9,(short)uVar9 + L'\x02');
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  if (0 < (int)uVar2) {
    iVar14 = 3;
    if (3 < iVar11) {
      iVar14 = iVar11;
    }
    iVar11 = 2;
    do {
      this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,iVar11);
      UnicodeString::operator=(this_00,pUVar6);
      iVar11 = iVar11 + 1;
    } while (iVar14 != iVar11);
  }
  uVar2 = (uint)local_70.fUnion.fStackFields.fLengthAndFlags;
  uVar7 = local_70.fUnion.fFields.fLength;
  if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
    uVar7 = (int)uVar2 >> 5;
  }
  if (0 < (int)uVar7) {
    pcVar1 = local_70.fUnion.fStackFields.fBuffer;
    uVar12 = 0;
    do {
      uVar9 = 0xffff;
      if (uVar12 < (uint)uVar7) {
        uVar8 = pcVar1;
        if ((uVar2 & 2) == 0) {
          uVar8 = local_70.fUnion.fFields.fArray;
        }
        uVar9 = (uint)(ushort)*(char16_t *)(uVar8 + uVar12 * 2);
      }
      index = 0x10001;
      if (uVar12 + 1 < (ulong)(uint)uVar7) {
        uVar8 = pcVar1;
        if ((uVar2 & 2) == 0) {
          uVar8 = local_70.fUnion.fFields.fArray;
        }
        index = (ushort)*(char16_t *)(uVar8 + (uVar12 + 1) * 2) + 2;
      }
      pUVar6 = (UnicodeString *)UVector::elementAt(this->fSafeTable,index);
      UnicodeString::setCharAt(pUVar6,uVar9,L'\0');
      uVar2 = (uint)local_70.fUnion.fStackFields.fLengthAndFlags;
      uVar7 = local_70.fUnion.fFields.fLength;
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        uVar7 = (int)uVar2 >> 5;
      }
      uVar12 = uVar12 + 2;
    } while ((int)uVar12 < (int)uVar7);
  }
  local_88._0_4_ = 1;
  local_88._4_4_ = 0;
  while (bVar15 = findDuplicateSafeState(this,(IntPair *)local_88), bVar15) {
    removeSafeState(this,(IntPair)local_88._0_8_);
  }
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void RBBITableBuilder::buildSafeReverseTable(UErrorCode &status) {
    // The safe table creation has three steps:

    // 1. Identifiy pairs of character classes that are "safe." Safe means that boundaries
    // following the pair do not depend on context or state before the pair. To test
    // whether a pair is safe, run it through the main forward state table, starting
    // from each state. If the the final state is the same, no matter what the starting state,
    // the pair is safe.
    //
    // 2. Build a state table that recognizes the safe pairs. It's similar to their
    // forward table, with a column for each input character [class], and a row for
    // each state. Row 1 is the start state, and row 0 is the stop state. Initially
    // create an additional state for each input character category; being in
    // one of these states means that the character has been seen, and is potentially
    // the first of a pair. In each of these rows, the entry for the second character
    // of a safe pair is set to the stop state (0), indicating that a match was found.
    // All other table entries are set to the state corresponding the current input
    // character, allowing that charcter to be the of a start following pair.
    //
    // Because the safe rules are to be run in reverse, moving backwards in the text,
    // the first and second pair categories are swapped when building the table.
    //
    // 3. Compress the table. There are typically many rows (states) that are
    // equivalent - that have zeroes (match completed) in the same columns -
    // and can be folded together.

    // Each safe pair is stored as two UChars in the safePair string.
    UnicodeString safePairs;

    int32_t numCharClasses = fRB->fSetBuilder->getNumCharCategories();
    int32_t numStates = fDStates->size();

    for (int32_t c1=0; c1<numCharClasses; ++c1) {
        for (int32_t c2=0; c2 < numCharClasses; ++c2) {
            int32_t wantedEndState = -1;
            int32_t endState = 0;
            for (int32_t startState = 1; startState < numStates; ++startState) {
                RBBIStateDescriptor *startStateD = static_cast<RBBIStateDescriptor *>(fDStates->elementAt(startState));
                int32_t s2 = startStateD->fDtran->elementAti(c1);
                RBBIStateDescriptor *s2StateD = static_cast<RBBIStateDescriptor *>(fDStates->elementAt(s2));
                endState = s2StateD->fDtran->elementAti(c2);
                if (wantedEndState < 0) {
                    wantedEndState = endState;
                } else {
                    if (wantedEndState != endState) {
                        break;
                    }
                }
            }
            if (wantedEndState == endState) {
                safePairs.append((char16_t)c1);
                safePairs.append((char16_t)c2);
                // printf("(%d, %d) ", c1, c2);
            }
        }
        // printf("\n");
    }

    // Populate the initial safe table.
    // The table as a whole is UVector<UnicodeString>
    // Each row is represented by a UnicodeString, being used as a Vector<int16>.
    // Row 0 is the stop state.
    // Row 1 is the start sate.
    // Row 2 and beyond are other states, initially one per char class, but
    //   after initial construction, many of the states will be combined, compacting the table.
    // The String holds the nextState data only. The four leading fields of a row, fAccepting,
    // fLookAhead, etc. are not needed for the safe table, and are omitted at this stage of building.

    U_ASSERT(fSafeTable == nullptr);
    fSafeTable = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, numCharClasses + 2, status);
    for (int32_t row=0; row<numCharClasses + 2; ++row) {
        fSafeTable->addElement(new UnicodeString(numCharClasses, 0, numCharClasses+4), status);
    }

    // From the start state, each input char class transitions to the state for that input.
    UnicodeString &startState = *static_cast<UnicodeString *>(fSafeTable->elementAt(1));
    for (int32_t charClass=0; charClass < numCharClasses; ++charClass) {
        // Note: +2 for the start & stop state.
        startState.setCharAt(charClass, static_cast<char16_t>(charClass+2));
    }

    // Initially make every other state table row look like the start state row,
    for (int32_t row=2; row<numCharClasses+2; ++row) {
        UnicodeString &rowState = *static_cast<UnicodeString *>(fSafeTable->elementAt(row));
        rowState = startState;   // UnicodeString assignment, copies contents.
    }

    // Run through the safe pairs, set the next state to zero when pair has been seen.
    // Zero being the stop state, meaning we found a safe point.
    for (int32_t pairIdx=0; pairIdx<safePairs.length(); pairIdx+=2) {
        int32_t c1 = safePairs.charAt(pairIdx);
        int32_t c2 = safePairs.charAt(pairIdx + 1);

        UnicodeString &rowState = *static_cast<UnicodeString *>(fSafeTable->elementAt(c2 + 2));
        rowState.setCharAt(c1, 0);
    }

    // Remove duplicate or redundant rows from the table.
    IntPair states = {1, 0};
    while (findDuplicateSafeState(&states)) {
        // printf("Removing duplicate safe states (%d, %d)\n", states.first, states.second);
        removeSafeState(states);
    }
}